

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

void __thiscall TextBuffer::set_text_in_range(TextBuffer *this,Range old_range,u16string *string)

{
  uint32_t *puVar1;
  Layer *pLVar2;
  ClipResult CVar3;
  TextBuffer *pTVar4;
  bool bVar5;
  uint32_t uVar6;
  Layer *this_00;
  Point PVar7;
  Point PVar8;
  Point PVar9;
  uint __flags;
  bool change_is_noop;
  Point new_range_end;
  optional<Patch::Change> change;
  const_iterator new_text_iter;
  Text new_text;
  char local_149;
  ClipResult local_148;
  ClipResult local_138;
  TextBuffer *local_128;
  Point local_120;
  Point local_118;
  Point local_110;
  Point local_108;
  Point local_100;
  optional<Patch::Change> local_f8;
  const_iterator local_b0;
  Text local_a8;
  optional<Text> local_70;
  
  local_118 = old_range.end;
  local_120 = old_range.start;
  pLVar2 = this->top_layer;
  if ((pLVar2 == this->base_layer) || (pLVar2->snapshot_count != 0)) {
    this_00 = (Layer *)operator_new(0xa0);
    Layer::Layer(this_00,pLVar2);
    this->top_layer = this_00;
  }
  local_148 = clip_position(this,local_120);
  bVar5 = Point::operator==(&local_118,&local_120);
  if (bVar5) {
    local_138 = local_148;
  }
  else {
    local_138 = clip_position(this,local_118);
  }
  PVar7 = Point::traversal(&local_138.position,&local_148.position);
  Text::Text(&local_a8,string);
  PVar8 = Text::extent(&local_a8);
  local_f8.value.old_start = Text::extent(&local_a8);
  local_100 = Point::traverse(&local_148.position,(Point *)&local_f8);
  __flags = local_138.offset - local_148.offset;
  local_f8.value.old_start = Point::traversal(&this->top_layer->extent_,&local_138.position);
  PVar9 = Point::traverse(&local_100,(Point *)&local_f8);
  this->top_layer->extent_ = PVar9;
  uVar6 = Text::size(&local_a8);
  CVar3 = local_148;
  pLVar2 = this->top_layer;
  puVar1 = &pLVar2->size_;
  *puVar1 = *puVar1 + (uVar6 - __flags);
  local_128 = this;
  optional<Text>::optional((optional<Text> *)&local_f8);
  optional<Text>::optional(&local_70,&local_a8);
  Patch::splice(&pLVar2->patch,CVar3.position.row,(__off64_t *)PVar7,PVar8.row,
                (__off64_t *)&local_f8,(size_t)&local_70,__flags);
  Text::~Text(&local_70.value);
  Text::~Text((Text *)&local_f8);
  Patch::grab_change_starting_before_new_position
            (&local_f8,&local_128->top_layer->patch,local_148.position);
  if (local_f8.is_some == true) {
    uVar6 = Text::size(local_f8.value.new_text);
    if (local_f8.value.old_text_size == uVar6) {
      local_149 = '\x01';
      local_b0 = Text::begin_abi_cxx11_(local_f8.value.new_text);
      pTVar4 = local_128;
      local_70.value.content._M_string_length = (size_type)&local_b0;
      local_70.value.content._M_dataplus._M_p = (pointer)&local_149;
      Layer::
      for_each_chunk_in_range<TextBuffer::set_text_in_range(Range,std::__cxx11::u16string&&)::__0>
                (local_128->top_layer->previous_layer,local_f8.value.old_start,
                 local_f8.value.old_end,(anon_class_16_2_1908bdce *)&local_70,
                 SUB81(local_70.value.content._M_string_length,0));
      PVar7 = local_f8.value.old_start;
      if (local_149 == '\x01') {
        pLVar2 = pTVar4->top_layer;
        Point::Point(&local_108);
        Point::Point(&local_110);
        Patch::splice_old(&pLVar2->patch,PVar7,local_108,local_110);
      }
    }
  }
  Text::~Text(&local_a8);
  return;
}

Assistant:

void TextBuffer::set_text_in_range(Range old_range, u16string &&string) {
  if (top_layer == base_layer || top_layer->snapshot_count > 0) {
    top_layer = new Layer(top_layer);
  }

  auto start = clip_position(old_range.start);
  auto end = old_range.end == old_range.start ? start : clip_position(old_range.end);
  Point deleted_extent = end.position.traversal(start.position);
  Text new_text{move(string)};
  Point inserted_extent = new_text.extent();
  Point new_range_end = start.position.traverse(new_text.extent());
  uint32_t deleted_text_size = end.offset - start.offset;
  top_layer->extent_ = new_range_end.traverse(top_layer->extent_.traversal(end.position));
  top_layer->size_ += new_text.size() - deleted_text_size;
  top_layer->patch.splice(
    start.position,
    deleted_extent,
    inserted_extent,
    optional<Text>{},
    move(new_text),
    deleted_text_size
  );

  auto change = top_layer->patch.grab_change_starting_before_new_position(start.position);
  if (change && change->old_text_size == change->new_text->size()) {
    bool change_is_noop = true;
    auto new_text_iter = change->new_text->begin();
    top_layer->previous_layer->for_each_chunk_in_range(
      change->old_start,
      change->old_end,
      [&change_is_noop, &new_text_iter](TextSlice chunk) {
        auto new_text_end = new_text_iter + chunk.size();
        if (!std::equal(new_text_iter, new_text_end, chunk.begin())) {
          change_is_noop = false;
          return true;
        }
        new_text_iter = new_text_end;
        return false;
      });
    if (change_is_noop) {
      top_layer->patch.splice_old(change->old_start, Point(), Point());
    }
  }
}